

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableBeginInitMemory(ImGuiTable *table,int columns_count)

{
  ImGuiTableColumn *pIVar1;
  void *__s;
  ImGuiTableColumn *pIVar2;
  ImGuiTableCellData *pIVar3;
  size_t size;
  
  size = (size_t)(columns_count * 0x71);
  __s = MemAlloc(size);
  table->RawData = __s;
  memset(__s,0,size);
  pIVar1 = (ImGuiTableColumn *)table->RawData;
  pIVar2 = (ImGuiTableColumn *)((long)&pIVar1->Flags + (long)(columns_count * 0x68));
  (table->Columns).Data = pIVar1;
  (table->Columns).DataEnd = pIVar2;
  pIVar3 = (ImGuiTableCellData *)((long)&pIVar1->Flags + (long)(columns_count * 0x69));
  (table->DisplayOrderToIndex).Data = (char *)pIVar2;
  (table->DisplayOrderToIndex).DataEnd = (char *)pIVar3;
  (table->RowCellData).Data = pIVar3;
  (table->RowCellData).DataEnd = (ImGuiTableCellData *)((long)&pIVar1->Flags + size);
  return;
}

Assistant:

void ImGui::TableBeginInitMemory(ImGuiTable* table, int columns_count)
{
    // Allocate single buffer for our arrays
    ImSpanAllocator<3> span_allocator;
    span_allocator.ReserveBytes(0, columns_count * sizeof(ImGuiTableColumn));
    span_allocator.ReserveBytes(1, columns_count * sizeof(ImGuiTableColumnIdx));
    span_allocator.ReserveBytes(2, columns_count * sizeof(ImGuiTableCellData));
    table->RawData = IM_ALLOC(span_allocator.GetArenaSizeInBytes());
    memset(table->RawData, 0, span_allocator.GetArenaSizeInBytes());
    span_allocator.SetArenaBasePtr(table->RawData);
    span_allocator.GetSpan(0, &table->Columns);
    span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
    span_allocator.GetSpan(2, &table->RowCellData);
}